

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-take.c
# Opt level: O0

_Bool borg_flow_take_lunal(_Bool viewable,wchar_t nearness)

{
  byte bVar1;
  byte bVar2;
  object_kind *poVar3;
  _Bool _Var4;
  wchar_t wVar5;
  wchar_t y_00;
  loc grid2;
  borg_take *pbVar6;
  char *pcVar7;
  bool local_51;
  _Bool item_bad;
  object_kind *k_ptr;
  borg_take *take;
  borg_grid *ag;
  wchar_t local_28;
  wchar_t b_stair;
  wchar_t b_j;
  wchar_t j;
  wchar_t y;
  wchar_t x;
  wchar_t ii;
  wchar_t i;
  wchar_t nearness_local;
  _Bool viewable_local;
  
  local_28 = L'\xffffffff';
  ag._4_4_ = L'\xffffffff';
  if (borg_takes_cnt == 0) {
    i._3_1_ = false;
  }
  else {
    for (x = L'\0'; x < track_less.num; x = x + L'\x01') {
      grid2 = loc(track_less.x[x],track_less.y[x]);
      wVar5 = distance(borg.c,grid2);
      if (local_28 < wVar5) {
        ag._4_4_ = x;
        local_28 = wVar5;
      }
    }
    borg_temp_n = 0;
    for (x = L'\x01'; x < borg_takes_nxt; x = x + L'\x01') {
      pbVar6 = borg_takes + x;
      poVar3 = pbVar6->kind;
      if (poVar3 != (object_kind *)0x0) {
        bVar1 = pbVar6->x;
        wVar5 = (wchar_t)bVar1;
        bVar2 = pbVar6->y;
        y_00 = (wchar_t)bVar2;
        local_51 = pbVar6->tval == L'#';
        if (local_51) {
          pcVar7 = format("# Lunal Item %s, at %d,%d",pbVar6->kind->name,(ulong)(uint)y_00,
                          (ulong)(uint)wVar5);
          borg_note(pcVar7);
        }
        local_51 = !local_51;
        if ((local_51) && (L'\0' < pbVar6->value)) {
          _Var4 = borg_is_ammo(pbVar6->tval);
          if (_Var4) {
            for (y = (uint)z_info->pack_size + L'\f';
                y < (int)(z_info->pack_size + 0xc + (uint)z_info->quiver_size); y = y + L'\x01') {
              if ((((borg_items[y].iqty != '\0') &&
                   ((ushort)borg_items[y].iqty != z_info->quiver_slot_size)) &&
                  (pbVar6->kind->kidx == borg_items[y].kind)) &&
                 ((poVar3->sval == (uint)borg_items[y].sval &&
                  (poVar3->tval == (uint)borg_items[y].tval)))) {
                local_51 = false;
              }
            }
          }
          else if (borg_items[(int)(((uint)z_info->pack_size - borg.trait[0x9e]) + -1)].iqty != '\0'
                  ) {
            for (y = L'\0'; y < (int)((uint)z_info->pack_size - borg.trait[0x9e]); y = y + L'\x01')
            {
              if ((((borg_items[y].iqty != '\0') && (pbVar6->kind->kidx == borg_items[y].kind)) &&
                  ((poVar3->sval == (uint)borg_items[y].sval &&
                   (poVar3->tval == (uint)borg_items[y].tval)))) &&
                 (((borg_items[y].tval == '\x1a' || (borg_items[y].tval == '\x19')) ||
                  (borg_items[y].tval == '\x18')))) {
                local_51 = false;
              }
            }
          }
        }
        if (((borg_items[(int)(((uint)z_info->pack_size - borg.trait[0x9e]) + -1)].iqty == '\0') &&
            (local_51)) &&
           ((_Var4 = borg_is_ammo(pbVar6->tval), !_Var4 ||
            (borg_items[(int)((uint)z_info->pack_size + (uint)z_info->quiver_size + 0xb)].iqty ==
             '\0')))) {
          if (((pbVar6->tval == L'\x1a') && (sv_potion_inc_str <= pbVar6->kind->sval)) &&
             (pbVar6->kind->sval <= sv_potion_detect_invis)) {
            pcVar7 = format("# Lunal Item %s, at %d,%d",pbVar6->kind->name,(ulong)(uint)y_00,
                            (ulong)(uint)wVar5);
            borg_note(pcVar7);
          }
          _Var4 = flag_has_dbg(pbVar6->kind->kind_flags,2,4,"take->kind->kind_flags","KF_INSTA_ART")
          ;
          if (_Var4) {
            pcVar7 = format("# Lunal Item %s, at %d,%d",pbVar6->kind->name,(ulong)(uint)y_00,
                            (ulong)(uint)wVar5);
            borg_note(pcVar7);
          }
        }
        if (((!viewable) || ((borg_grids[y_00][wVar5].info & 0x20) != 0)) &&
           (_Var4 = borg_flow_far_from_stairs(wVar5,y_00,ag._4_4_), !_Var4)) {
          borg_temp_x[borg_temp_n] = bVar1;
          borg_temp_y[borg_temp_n] = bVar2;
          borg_temp_n = borg_temp_n + 1;
        }
      }
    }
    if (borg_temp_n == 0) {
      i._3_1_ = false;
    }
    else {
      borg_flow_clear();
      for (x = L'\0'; x < borg_temp_n; x = x + L'\x01') {
        borg_flow_enqueue_grid((uint)borg_temp_y[x],(uint)borg_temp_x[x]);
      }
      borg_flow_spread(nearness,false,(_Bool)((viewable ^ 0xffU) & 1),false,L'\xffffffff',true);
      _Var4 = borg_flow_commit("munchkin item",L'\x02');
      if (_Var4) {
        _Var4 = borg_check_light();
        if (_Var4) {
          i._3_1_ = true;
        }
        else {
          _Var4 = borg_flow_old(L'\x02');
          if (_Var4) {
            i._3_1_ = true;
          }
          else {
            i._3_1_ = false;
          }
        }
      }
      else {
        i._3_1_ = false;
      }
    }
  }
  return i._3_1_;
}

Assistant:

bool borg_flow_take_lunal(bool viewable, int nearness)
{
    int i, ii, x, y;
    int j;
    int b_j     = -1;
    int b_stair = -1;

    borg_grid *ag;

    /* Efficiency -- Nothing to take */
    if (!borg_takes_cnt)
        return false;

    /* Check for an existing "up stairs" */
    for (i = 0; i < track_less.num; i++) {
        x = track_less.x[i];
        y = track_less.y[i];

        /* How far is the nearest up stairs */
        j = distance(borg.c, loc(x, y));

        /* skip the closer ones */
        if (b_j >= j)
            continue;

        /* track it */
        b_j     = j;
        b_stair = i;
    }

    /* Nothing yet */
    borg_temp_n = 0;

    /* Scan the object list -- set filter*/
    for (i = 1; i < borg_takes_nxt; i++) {
        borg_take          *take  = &borg_takes[i];
        struct object_kind *k_ptr = take->kind;

        bool item_bad;

        /* Skip dead objects */
        if (!k_ptr)
            continue;

        /* Access the location */
        x = take->x;
        y = take->y;

        /* all items start bad */
        item_bad = true;

        /* Gold is good to have */
        if (take->tval == TV_GOLD) {
            borg_note(
                format("# Lunal Item %s, at %d,%d", take->kind->name, y, x));
            item_bad = false;
        }

        /* If full can I absorb the item into an existing stack */
        if (item_bad && take->value > 0) {
            if (borg_is_ammo(take->tval)) {
                /* Scan the quiver */
                for (ii = QUIVER_START; ii < QUIVER_END; ii++) {
                    /* skip empty slots */
                    if (!borg_items[ii].iqty)
                        continue;

                    /* skip full slots */
                    if (borg_items[ii].iqty == z_info->quiver_slot_size)
                        continue;

                    /* Both objects should have the same kind value */
                    if (take->kind->kidx != borg_items[ii].kind)
                        continue;

                    if (k_ptr->sval == borg_items[ii].sval
                        && k_ptr->tval == borg_items[ii].tval) {
                        item_bad = false;
                    }
                }
            } else if (borg_items[PACK_SLOTS - 1].iqty) {
                /* Scan the inventory */
                for (ii = 0; ii < PACK_SLOTS; ii++) {
                    /* skip empty slots */
                    if (!borg_items[ii].iqty)
                        continue;

                    /* Both objects should have the same kind value */
                    if (take->kind->kidx != borg_items[ii].kind)
                        continue;

                    /* Certain types of items can stack */
                    if (k_ptr->sval == borg_items[ii].sval
                        && k_ptr->tval == borg_items[ii].tval
                        && (borg_items[ii].tval == TV_POTION
                            || borg_items[ii].tval == TV_SCROLL
                            || borg_items[ii].tval == TV_ROD)) {
                        item_bad = false;
                    }
                }
            }
        }

        /* Require one empty slot */
        if (!borg_items[PACK_SLOTS - 1].iqty && item_bad == true) {
            /* for ammo, make sure the quiver isn't full */
            if (!borg_is_ammo(take->tval)
                || borg_items[QUIVER_END - 1].iqty == 0) {

                /* Certain Potions are worthless */
                if (take->tval == TV_POTION
                    && (take->kind->sval >= sv_potion_inc_str)
                    && (take->kind->sval <= sv_potion_detect_invis)) {
                    borg_note(format(
                        "# Lunal Item %s, at %d,%d", take->kind->name, y, x));
                    item_bad = false;
                }

                /* Certain insta_arts are good.  Note that there is no top end
                 * of this.  So if an item were added after the last artifact,
                 * it would also be picked up.
                 */
                if (kf_has(take->kind->kind_flags, KF_INSTA_ART)) {
                    borg_note(format(
                        "# Lunal Item %s, at %d,%d", take->kind->name, y, x));
                    item_bad = false;
                }

                /* if scumming the start of the game, take all items to sell
                 * them */
                if (borg_cfg[BORG_MUNCHKIN_START]) {
                    /* Certain known items are junky and should be ignored. Grab
                     * only things of value
                     */
                    if (take->value >= 1)
                        item_bad = false;
                }
            }
        }

        /* Get the grid */
        ag = &borg_grids[y][x];

        /* Require line of sight if requested */
        if (viewable && !(ag->info & BORG_VIEW))
            continue;

        /* don't go too far from the stairs */
        if (borg_flow_far_from_stairs(x, y, b_stair))
            continue;

        /* Careful -- Remember it */
        borg_temp_x[borg_temp_n] = x;
        borg_temp_y[borg_temp_n] = y;
        borg_temp_n++;
    }

    /* Nothing to take */
    if (!borg_temp_n)
        return false;

    /* Clear the flow codes */
    borg_flow_clear();

    /* Look for something to take */
    for (i = 0; i < borg_temp_n; i++) {
        /* Enqueue the grid */
        borg_flow_enqueue_grid(borg_temp_y[i], borg_temp_x[i]);
    }

    /* Spread the flow */
    /* if we are not flowing toward items that we can see, make sure they */
    /* are at least easily reachable.  The second flag is weather or not  */
    /* to avoid unknown squares.  This was for performance. */
    borg_flow_spread(nearness, false, !viewable, false, -1, true);

    /* Attempt to Commit the flow */
    if (!borg_flow_commit("munchkin item", GOAL_TAKE))
        return false;

    /* Check for monsters before walking over to the item */
    if (borg_check_light())
        return true;

    /* Take one step */
    if (!borg_flow_old(GOAL_TAKE))
        return false;

    /* Success */
    return true;
}